

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::~TGlslangToSpvTraverser
          (TGlslangToSpvTraverser *this)

{
  unordered_map<long_long,_std::vector<int,_std::allocator<int>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_38;
  unordered_map<unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>_>
  *local_18;
  TGlslangToSpvTraverser *this_local;
  
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__TGlslangToSpvTraverser_013ae1a0;
  std::
  unordered_map<unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>_>
  ::~unordered_map(&this->idToQCOMDecorations);
  local_18 = &this->idToQCOMDecorations;
  do {
    local_18 = local_18 + -1;
    std::
    unordered_map<unsigned_int,_glslang::TIntermSymbol_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_glslang::TIntermSymbol_*>_>_>
    ::~unordered_map((unordered_map<unsigned_int,_glslang::TIntermSymbol_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_glslang::TIntermSymbol_*>_>_>
                      *)local_18);
  } while (local_18 !=
           (unordered_map<unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>_>
            *)this->locationToSymbol);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map(&this->forceType);
  std::
  map<const_glslang::TType_*,_unsigned_int,_std::less<const_glslang::TType_*>,_std::allocator<std::pair<const_glslang::TType_*const,_unsigned_int>_>_>
  ::~map(&this->forwardPointers);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_glslang::TIntermSymbol_*>_>_>
  ::~unordered_map(&this->counterOriginator);
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::~stack(&this->breakForLoop);
  std::
  unordered_map<const_glslang::TVector<glslang::TTypeLoc>_*,_long_long,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_long_long>_>_>
  ::~unordered_map(&this->glslangTypeToIdMap);
  std::
  unordered_map<long_long,_std::vector<int,_std::allocator<int>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~unordered_map(&this->memberRemapper);
  local_38 = &this->memberRemapper;
  do {
    local_38 = local_38 + -1;
    std::
    unordered_map<const_glslang::TVector<glslang::TTypeLoc>_*,_unsigned_int,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<const_glslang::TVector<glslang::TTypeLoc>_*,_unsigned_int,_std::hash<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::equal_to<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_unsigned_int>_>_>
                      *)local_38);
  } while (local_38 !=
           (unordered_map<long_long,_std::vector<int,_std::allocator<int>_>,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_std::vector<int,_std::allocator<int>_>_>_>_>
            *)this->structMap);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spv::Function_*>_>_>
  ::~unordered_map(&this->functionMap);
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::~unordered_set(&this->rValueParameters);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map(&this->builtInVariableIds);
  std::
  unordered_map<long_long,_unsigned_int,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_int>_>_>
  ::~unordered_map(&this->symbolValues);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~unordered_map(&this->extBuiltinMap);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&this->iOSet)
  ;
  spv::Builder::~Builder(&this->builder);
  glslang::TIntermTraverser::~TIntermTraverser(&this->super_TIntermTraverser);
  return;
}

Assistant:

virtual ~TGlslangToSpvTraverser() { }